

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O3

void __thiscall HydEngine::advance(HydEngine *this,int *tstep)

{
  Network *pNVar1;
  pointer ppPVar2;
  int iVar3;
  int iVar4;
  pointer ppPVar5;
  int iVar6;
  
  *tstep = 0;
  if (this->engineState == INITIALIZED) {
    iVar4 = 0;
    this->hydStep = 0;
    iVar6 = (this->network->options).timeOptions[8] - this->currentTime;
    if (this->halted != false) {
      iVar6 = 0;
    }
    if (0 < iVar6) {
      iVar3 = getTimeStep(this);
      iVar4 = iVar6;
      if (iVar3 < iVar6) {
        iVar4 = iVar3;
      }
      this->hydStep = iVar4;
    }
    *tstep = iVar4;
    updateEnergyUsage(this);
    updateTanks(this);
    iVar4 = this->currentTime + this->hydStep;
    this->currentTime = iVar4;
    pNVar1 = this->network;
    if (this->rptTime <= iVar4) {
      this->rptTime = this->rptTime + (pNVar1->options).timeOptions[5];
    }
    ppPVar2 = (pNVar1->patterns).super__Vector_base<Pattern_*,_std::allocator<Pattern_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppPVar5 = (pNVar1->patterns).super__Vector_base<Pattern_*,_std::allocator<Pattern_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppPVar5 != ppPVar2;
        ppPVar5 = ppPVar5 + 1) {
      (*((*ppPVar5)->super_Element)._vptr_Element[4])(*ppPVar5,(ulong)(uint)this->currentTime);
    }
  }
  return;
}

Assistant:

void HydEngine::advance(int* tstep)
{
    *tstep = 0;
    if ( engineState != HydEngine::INITIALIZED ) return;

    // ... save current results to hydraulics file
    //if ( saveToFile ) errcode = hydWriter.writeResults(hydState, hydTime);

    // ... if time remains, find time (hydStep) until next hydraulic event

    hydStep = 0;
    int timeLeft = network->option(Options::TOTAL_DURATION) - currentTime;
    if ( halted ) timeLeft = 0;
    if ( timeLeft > 0  )
    {
        hydStep = getTimeStep();
        if ( hydStep > timeLeft ) hydStep = timeLeft;
    }
    *tstep = hydStep;

    // ... update energy usage and tank levels over the time step

    updateEnergyUsage();
    updateTanks();

    // ... advance time counters

    currentTime += hydStep;
    if ( currentTime >= rptTime )
    {
        rptTime += network->option(Options::REPORT_STEP);
    }

    // ... advance time patterns

    updatePatterns();
}